

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O2

void __thiscall
RecoveryTest_PureVirtualMethodCallTest_Test::RecoveryTest_PureVirtualMethodCallTest_Test
          (RecoveryTest_PureVirtualMethodCallTest_Test *this)

{
  RecoveryTest::RecoveryTest(&this->super_RecoveryTest);
  (this->super_RecoveryTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0013ade8;
  return;
}

Assistant:

TEST_F (RecoveryTest, PureVirtualMethodCallTest) {
#ifdef _WIN32
    const char regex[] = "::PureCallHandler";
#else
    const char regex[] = "PosixCrashHandler::handleCrash";
#endif
    
    ASSERT_EXIT(Derived(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}